

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVm.cpp
# Opt level: O0

char * GetInstructionName(RegVmInstructionCode code)

{
  char *pcStack_10;
  RegVmInstructionCode code_local;
  
  switch(code) {
  case rviNop:
    pcStack_10 = "nop";
    break;
  case rviLoadByte:
    pcStack_10 = "loadb";
    break;
  case rviLoadWord:
    pcStack_10 = "loadw";
    break;
  case rviLoadDword:
    pcStack_10 = "load";
    break;
  case rviLoadLong:
    pcStack_10 = "loadq";
    break;
  case rviLoadFloat:
    pcStack_10 = "loadf";
    break;
  case rviLoadDouble:
    pcStack_10 = "loadd";
    break;
  case rviLoadImm:
    pcStack_10 = "loadimm";
    break;
  case rviStoreByte:
    pcStack_10 = "storeb";
    break;
  case rviStoreWord:
    pcStack_10 = "storew";
    break;
  case rviStoreDword:
    pcStack_10 = "store";
    break;
  case rviStoreLong:
    pcStack_10 = "storeq";
    break;
  case rviStoreFloat:
    pcStack_10 = "storef";
    break;
  case rviStoreDouble:
    pcStack_10 = "stored";
    break;
  case rviCombinedd:
    pcStack_10 = "combdd";
    break;
  case rviBreakupdd:
    pcStack_10 = "breakdd";
    break;
  case rviMov:
    pcStack_10 = "mov";
    break;
  case rviMovMult:
    pcStack_10 = "movmult";
    break;
  case rviDtoi:
    pcStack_10 = "dtoi";
    break;
  case rviDtol:
    pcStack_10 = "dtol";
    break;
  case rviDtof:
    pcStack_10 = "dtof";
    break;
  case rviItod:
    pcStack_10 = "itod";
    break;
  case rviLtod:
    pcStack_10 = "ltod";
    break;
  case rviItol:
    pcStack_10 = "itol";
    break;
  case rviLtoi:
    pcStack_10 = "ltoi";
    break;
  case rviIndex:
    pcStack_10 = "index";
    break;
  case rviGetAddr:
    pcStack_10 = "getaddr";
    break;
  case rviSetRange:
    pcStack_10 = "setrange";
    break;
  case rviMemCopy:
    pcStack_10 = "memcopy";
    break;
  case rviJmp:
    pcStack_10 = "jmp";
    break;
  case rviJmpz:
    pcStack_10 = "jmpz";
    break;
  case rviJmpnz:
    pcStack_10 = "jmpnz";
    break;
  case rviCall:
    pcStack_10 = "call";
    break;
  case rviCallPtr:
    pcStack_10 = "callp";
    break;
  case rviReturn:
    pcStack_10 = "ret";
    break;
  case rviAddImm:
    pcStack_10 = "addimm";
    break;
  case rviAdd:
    pcStack_10 = "add";
    break;
  case rviSub:
    pcStack_10 = "sub";
    break;
  case rviMul:
    pcStack_10 = "mul";
    break;
  case rviDiv:
    pcStack_10 = "div";
    break;
  case rviPow:
    pcStack_10 = "pow";
    break;
  case rviMod:
    pcStack_10 = "mod";
    break;
  case rviLess:
    pcStack_10 = "less";
    break;
  case rviGreater:
    pcStack_10 = "greater";
    break;
  case rviLequal:
    pcStack_10 = "lequal";
    break;
  case rviGequal:
    pcStack_10 = "gequal";
    break;
  case rviEqual:
    pcStack_10 = "equal";
    break;
  case rviNequal:
    pcStack_10 = "nequal";
    break;
  case rviShl:
    pcStack_10 = "shl";
    break;
  case rviShr:
    pcStack_10 = "shr";
    break;
  case rviBitAnd:
    pcStack_10 = "bitand";
    break;
  case rviBitOr:
    pcStack_10 = "bitor";
    break;
  case rviBitXor:
    pcStack_10 = "bitxor";
    break;
  case rviAddImml:
    pcStack_10 = "addimml";
    break;
  case rviAddl:
    pcStack_10 = "addl";
    break;
  case rviSubl:
    pcStack_10 = "subl";
    break;
  case rviMull:
    pcStack_10 = "mull";
    break;
  case rviDivl:
    pcStack_10 = "divl";
    break;
  case rviPowl:
    pcStack_10 = "powl";
    break;
  case rviModl:
    pcStack_10 = "modl";
    break;
  case rviLessl:
    pcStack_10 = "lessl";
    break;
  case rviGreaterl:
    pcStack_10 = "greaterl";
    break;
  case rviLequall:
    pcStack_10 = "lequall";
    break;
  case rviGequall:
    pcStack_10 = "gequall";
    break;
  case rviEquall:
    pcStack_10 = "equall";
    break;
  case rviNequall:
    pcStack_10 = "nequall";
    break;
  case rviShll:
    pcStack_10 = "shll";
    break;
  case rviShrl:
    pcStack_10 = "shrl";
    break;
  case rviBitAndl:
    pcStack_10 = "bitandl";
    break;
  case rviBitOrl:
    pcStack_10 = "bitorl";
    break;
  case rviBitXorl:
    pcStack_10 = "bitxorl";
    break;
  case rviAddd:
    pcStack_10 = "addd";
    break;
  case rviSubd:
    pcStack_10 = "subd";
    break;
  case rviMuld:
    pcStack_10 = "muld";
    break;
  case rviDivd:
    pcStack_10 = "divd";
    break;
  case rviAddf:
    pcStack_10 = "addf";
    break;
  case rviSubf:
    pcStack_10 = "subf";
    break;
  case rviMulf:
    pcStack_10 = "mulf";
    break;
  case rviDivf:
    pcStack_10 = "divf";
    break;
  case rviPowd:
    pcStack_10 = "powd";
    break;
  case rviModd:
    pcStack_10 = "modd";
    break;
  case rviLessd:
    pcStack_10 = "lessd";
    break;
  case rviGreaterd:
    pcStack_10 = "greaterd";
    break;
  case rviLequald:
    pcStack_10 = "lequald";
    break;
  case rviGequald:
    pcStack_10 = "gequald";
    break;
  case rviEquald:
    pcStack_10 = "equald";
    break;
  case rviNequald:
    pcStack_10 = "nequald";
    break;
  case rviNeg:
    pcStack_10 = "neg";
    break;
  case rviNegl:
    pcStack_10 = "negl";
    break;
  case rviNegd:
    pcStack_10 = "negd";
    break;
  case rviBitNot:
    pcStack_10 = "bitnot";
    break;
  case rviBitNotl:
    pcStack_10 = "bitnotl";
    break;
  case rviLogNot:
    pcStack_10 = "lognot";
    break;
  case rviLogNotl:
    pcStack_10 = "lognotl";
    break;
  case rviConvertPtr:
    pcStack_10 = "convertptr";
    break;
  case rviFuncAddr:
    pcStack_10 = "funcaddr";
    break;
  case rviTypeid:
    pcStack_10 = "typeid";
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVm.cpp"
                  ,0xcc,"const char *GetInstructionName(RegVmInstructionCode)");
  }
  return pcStack_10;
}

Assistant:

const char* GetInstructionName(RegVmInstructionCode code)
{
	switch(code)
	{
	case rviNop:
		return "nop";
	case rviLoadByte:
		return "loadb";
	case rviLoadWord:
		return "loadw";
	case rviLoadDword:
		return "load";
	case rviLoadLong:
		return "loadq";
	case rviLoadFloat:
		return "loadf";
	case rviLoadDouble:
		return "loadd";
	case rviLoadImm:
		return "loadimm";
	case rviStoreByte:
		return "storeb";
	case rviStoreWord:
		return "storew";
	case rviStoreDword:
		return "store";
	case rviStoreLong:
		return "storeq";
	case rviStoreFloat:
		return "storef";
	case rviStoreDouble:
		return "stored";
	case rviCombinedd:
		return "combdd";
	case rviBreakupdd:
		return "breakdd";
	case rviMov:
		return "mov";
	case rviMovMult:
		return "movmult";
	case rviDtoi:
		return "dtoi";
	case rviDtol:
		return "dtol";
	case rviDtof:
		return "dtof";
	case rviItod:
		return "itod";
	case rviLtod:
		return "ltod";
	case rviItol:
		return "itol";
	case rviLtoi:
		return "ltoi";
	case rviIndex:
		return "index";
	case rviGetAddr:
		return "getaddr";
	case rviSetRange:
		return "setrange";
	case rviMemCopy:
		return "memcopy";
	case rviJmp:
		return "jmp";
	case rviJmpz:
		return "jmpz";
	case rviJmpnz:
		return "jmpnz";
	case rviCall:
		return "call";
	case rviCallPtr:
		return "callp";
	case rviReturn:
		return "ret";
	case rviAddImm:
		return "addimm";
	case rviAdd:
		return "add";
	case rviSub:
		return "sub";
	case rviMul:
		return "mul";
	case rviDiv:
		return "div";
	case rviPow:
		return "pow";
	case rviMod:
		return "mod";
	case rviLess:
		return "less";
	case rviGreater:
		return "greater";
	case rviLequal:
		return "lequal";
	case rviGequal:
		return "gequal";
	case rviEqual:
		return "equal";
	case rviNequal:
		return "nequal";
	case rviShl:
		return "shl";
	case rviShr:
		return "shr";
	case rviBitAnd:
		return "bitand";
	case rviBitOr:
		return "bitor";
	case rviBitXor:
		return "bitxor";
	case rviAddImml:
		return "addimml";
	case rviAddl:
		return "addl";
	case rviSubl:
		return "subl";
	case rviMull:
		return "mull";
	case rviDivl:
		return "divl";
	case rviPowl:
		return "powl";
	case rviModl:
		return "modl";
	case rviLessl:
		return "lessl";
	case rviGreaterl:
		return "greaterl";
	case rviLequall:
		return "lequall";
	case rviGequall:
		return "gequall";
	case rviEquall:
		return "equall";
	case rviNequall:
		return "nequall";
	case rviShll:
		return "shll";
	case rviShrl:
		return "shrl";
	case rviBitAndl:
		return "bitandl";
	case rviBitOrl:
		return "bitorl";
	case rviBitXorl:
		return "bitxorl";
	case rviAddd:
		return "addd";
	case rviSubd:
		return "subd";
	case rviMuld:
		return "muld";
	case rviDivd:
		return "divd";
	case rviAddf:
		return "addf";
	case rviSubf:
		return "subf";
	case rviMulf:
		return "mulf";
	case rviDivf:
		return "divf";
	case rviPowd:
		return "powd";
	case rviModd:
		return "modd";
	case rviLessd:
		return "lessd";
	case rviGreaterd:
		return "greaterd";
	case rviLequald:
		return "lequald";
	case rviGequald:
		return "gequald";
	case rviEquald:
		return "equald";
	case rviNequald:
		return "nequald";
	case rviNeg:
		return "neg";
	case rviNegl:
		return "negl";
	case rviNegd:
		return "negd";
	case rviBitNot:
		return "bitnot";
	case rviBitNotl:
		return "bitnotl";
	case rviLogNot:
		return "lognot";
	case rviLogNotl:
		return "lognotl";
	case rviConvertPtr:
		return "convertptr";
	case rviFuncAddr:
		return "funcaddr";
	case rviTypeid:
		return "typeid";
	default:
		assert(!"unknown instruction");
	}

	return "";
}